

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9GenQbf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *pNew;
  char *pcVar3;
  Gia_Man_t *pTemp;
  int c;
  int fVerbose;
  char *pStr;
  uint local_30;
  int nLutSize;
  int nLutNum;
  int nFrames;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  nLutSize = 1;
  local_30 = 1;
  pStr._4_4_ = 6;
  _c = (char *)0x0;
  pTemp._4_4_ = 0;
  Extra_UtilGetoptReset();
LAB_0026333e:
  iVar1 = Extra_UtilGetopt(argc,argv,"FKNSvh");
  if (iVar1 == -1) {
    if (pAbc->pGia == (Gia_Man_t *)0x0) {
      Abc_Print(-1,"There is no current GIA.\n");
      return 1;
    }
    iVar1 = Gia_ManRegNum(pAbc->pGia);
    if (iVar1 == 0) {
      Abc_Print(-1,"Works only for sequential networks.\n");
      return 1;
    }
    iVar1 = Gia_ManRegNum(pAbc->pGia);
    if (iVar1 < (int)(pStr._4_4_ * local_30)) {
      uVar2 = Gia_ManRegNum(pAbc->pGia);
      Abc_Print(-1,"The number of flops (%d) is less than required (%d).\n",(ulong)uVar2,
                (ulong)(pStr._4_4_ * local_30));
      return 1;
    }
    if ((nLutSize == 1) && (local_30 == 1)) {
      pNew = Gia_GenQbfMiter(pAbc->pGia,1,1,pStr._4_4_,_c,pTemp._4_4_);
      Abc_FrameUpdateGia(pAbc,pNew);
      if (_c != (char *)0x0) {
        free(_c);
      }
      return 0;
    }
    Abc_Print(-1,"Currently this commands works for one frame and one LUT.\n");
    return 1;
  }
  switch(iVar1) {
  case 0x46:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
      goto LAB_00263669;
    }
    nLutSize = atoi(argv[globalUtilOptind]);
    uVar2 = nLutSize;
    break;
  default:
    goto LAB_00263669;
  case 0x4b:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-K\" should be followed by an integer.\n");
      goto LAB_00263669;
    }
    pStr._4_4_ = atoi(argv[globalUtilOptind]);
    uVar2 = pStr._4_4_;
    break;
  case 0x4e:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
      goto LAB_00263669;
    }
    local_30 = atoi(argv[globalUtilOptind]);
    uVar2 = local_30;
    break;
  case 0x53:
    if (globalUtilOptind < argc) goto LAB_002634d8;
    Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
    goto LAB_00263669;
  case 0x68:
    goto LAB_00263669;
  case 0x76:
    pTemp._4_4_ = pTemp._4_4_ ^ 1;
    goto LAB_0026333e;
  }
  globalUtilOptind = globalUtilOptind + 1;
  if ((int)uVar2 < 0) goto LAB_00263669;
  goto LAB_0026333e;
LAB_002634d8:
  _c = Abc_UtilStrsav(argv[globalUtilOptind]);
  globalUtilOptind = globalUtilOptind + 1;
  if (_c == (char *)0x0) {
LAB_00263669:
    Abc_Print(-2,"usage: &genqbf [-FKN num] [-vh]\n");
    Abc_Print(-2,"\t         generates QBF miter for computing an inductive invariant\n");
    Abc_Print(-2,"\t-F num : the number of time frames for induction [default = %d]\n",
              (ulong)(uint)nLutSize);
    Abc_Print(-2,"\t-K num : the LUT size [default = %d]\n",(ulong)pStr._4_4_);
    Abc_Print(-2,"\t-N num : the number of LUTs [default = %d]\n",(ulong)local_30);
    pcVar3 = "no";
    if (pTemp._4_4_ != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar3);
    Abc_Print(-2,"\t-h     : print the command usage\n");
    return 1;
  }
  goto LAB_0026333e;
}

Assistant:

int Abc_CommandAbc9GenQbf( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_GenQbfMiter( Gia_Man_t * pGia, int nFrames, int nLutNum, int nLutSize, char * pStr, int fVerbose );
    int nFrames   =    1;
    int nLutNum   =    1;
    int nLutSize  =    6;
    char * pStr   = NULL;
    int fVerbose  =    0;
    int c;
    Gia_Man_t * pTemp;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FKNSvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutSize < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nLutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutNum < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pStr = Abc_UtilStrsav(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pStr == NULL )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "There is no current GIA.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Works only for sequential networks.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) < nLutSize * nLutNum )
    {
        Abc_Print( -1, "The number of flops (%d) is less than required (%d).\n", Gia_ManRegNum(pAbc->pGia), nLutSize * nLutNum );
        return 1;
    }
    if ( nFrames != 1 || nLutNum != 1 )
    {
        Abc_Print( -1, "Currently this commands works for one frame and one LUT.\n" );
        return 1;
    }
    pTemp = Gia_GenQbfMiter( pAbc->pGia, nFrames, nLutNum, nLutSize, pStr, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    ABC_FREE( pStr );
    return 0;

usage:
    Abc_Print( -2, "usage: &genqbf [-FKN num] [-vh]\n" );
    Abc_Print( -2, "\t         generates QBF miter for computing an inductive invariant\n" );
    Abc_Print( -2, "\t-F num : the number of time frames for induction [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-K num : the LUT size [default = %d]\n", nLutSize );
    Abc_Print( -2, "\t-N num : the number of LUTs [default = %d]\n", nLutNum );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}